

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O2

int __thiscall State::inPlace(State *this)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  
  uVar1 = this->width;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  uVar3 = (ulong)(uint)this->height;
  if (this->height < 1) {
    uVar3 = uVar6;
  }
  iVar5 = this->size + -1;
  iVar8 = 1;
  iVar2 = 0;
  for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
      iVar2 = iVar2 + (uint)(iVar5 == (int)uVar4 || iVar8 + (int)uVar4 == this->tiles[uVar6][uVar4])
      ;
    }
    iVar5 = iVar5 - uVar1;
    iVar8 = iVar8 + uVar1;
  }
  return iVar2;
}

Assistant:

int State::inPlace() {
    int score = 0;
    for (int i = 0; i < height; i++) {
        for (int j = 0; j < width; j++) {
            int value = tiles[i][j];
            int expected = 1 + i * width + j;
            if (value == expected || expected == size)
                score++;
        }
    }
    return score;
}